

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O0

int __thiscall zmq::stream_engine_base_t::pull_and_encode(stream_engine_base_t *this,msg_t *msg_)

{
  int iVar1;
  undefined8 in_RSI;
  long in_RDI;
  int local_4;
  
  if (*(long *)(in_RDI + 0x540) == 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_mechanism != NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x270);
    fflush(_stderr);
    zmq_abort((char *)0x23a6b7);
  }
  iVar1 = (**(code **)(**(long **)(in_RDI + 0x648) + 0xf0))(*(long **)(in_RDI + 0x648),in_RSI);
  if (iVar1 == -1) {
    local_4 = -1;
  }
  else {
    iVar1 = (**(code **)(**(long **)(in_RDI + 0x540) + 0x20))(*(long **)(in_RDI + 0x540),in_RSI);
    if (iVar1 == -1) {
      local_4 = -1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int zmq::stream_engine_base_t::pull_and_encode (msg_t *msg_)
{
    zmq_assert (_mechanism != NULL);

    if (_session->pull_msg (msg_) == -1)
        return -1;
    if (_mechanism->encode (msg_) == -1)
        return -1;
    return 0;
}